

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

ZSTD_compressionParameters *
duckdb_zstd::ZSTD_getCParamsFromCCtxParams
          (ZSTD_CCtx_params *CCtxParams,U64 srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  ZSTD_compressionParameters cPar;
  unsigned_long_long in_RCX;
  long in_RDX;
  long in_RSI;
  ZSTD_compressionParameters *in_RDI;
  undefined4 in_R8D;
  ZSTD_compressionParameters cParams;
  uint local_54;
  ZSTD_paramSwitch_e in_stack_ffffffffffffffb0;
  ZSTD_cParamMode_e in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  ZSTD_strategy in_stack_ffffffffffffffc4;
  uint local_38;
  ZSTD_paramSwitch_e ZStack_34;
  undefined8 uVar1;
  uint uVar2;
  ZSTD_cParamMode_e in_stack_ffffffffffffffdc;
  uint uVar3;
  ZSTD_strategy in_stack_ffffffffffffffe0;
  ZSTD_strategy ZVar4;
  ZSTD_strategy ZVar5;
  
  ZVar5 = (ZSTD_strategy)in_RCX;
  if ((in_RDX == -1) && (0 < *(int *)(in_RSI + 0x40))) {
    in_RDX = (long)*(int *)(in_RSI + 0x40);
  }
  ZSTD_getCParams_internal
            ((int)((ulong)in_RDX >> 0x20),in_RCX,CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  ZStack_34 = in_stack_ffffffffffffffb0;
  local_38 = local_54;
  uVar1._4_4_ = in_stack_ffffffffffffffb8;
  uVar1._0_4_ = in_stack_ffffffffffffffb4;
  if (*(int *)(in_RSI + 0x60) == 1) {
    local_38 = 0x1b;
  }
  uVar2 = in_stack_ffffffffffffffbc;
  uVar3 = in_stack_ffffffffffffffc0;
  ZVar4 = in_stack_ffffffffffffffc4;
  ZSTD_overrideCParams
            ((ZSTD_compressionParameters *)&local_38,(ZSTD_compressionParameters *)(in_RSI + 4));
  cPar.hashLog = uVar2;
  cPar.windowLog = (uint)uVar1;
  cPar.chainLog = SUB84(uVar1,4);
  cPar.searchLog = uVar3;
  cPar.minMatch = ZVar4;
  cPar.targetLength = in_R8D;
  cPar.strategy = ZVar5;
  ZSTD_adjustCParams_internal
            (cPar,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb4
             ,in_stack_ffffffffffffffb0);
  return in_RDI;
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(
        const ZSTD_CCtx_params* CCtxParams, U64 srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode)
{
    ZSTD_compressionParameters cParams;
    if (srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN && CCtxParams->srcSizeHint > 0) {
      srcSizeHint = CCtxParams->srcSizeHint;
    }
    cParams = ZSTD_getCParams_internal(CCtxParams->compressionLevel, srcSizeHint, dictSize, mode);
    if (CCtxParams->ldmParams.enableLdm == ZSTD_ps_enable) cParams.windowLog = ZSTD_LDM_DEFAULT_WINDOW_LOG;
    ZSTD_overrideCParams(&cParams, &CCtxParams->cParams);
    assert(!ZSTD_checkCParams(cParams));
    /* srcSizeHint == 0 means 0 */
    return ZSTD_adjustCParams_internal(cParams, srcSizeHint, dictSize, mode, CCtxParams->useRowMatchFinder);
}